

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O2

int acmod_set_s2_parse_triphone
              (acmod_set_t *acmod_set,acmod_id_t *base,acmod_id_t *left,acmod_id_t *right,
              word_posn_t *posn,char *str)

{
  acmod_id_t aVar1;
  char *__s;
  char *pcVar2;
  char cVar3;
  long lVar4;
  int iVar5;
  
  __s = strdup(str);
  pcVar2 = strtok(__s,"(,)");
  aVar1 = acmod_set_name2id(acmod_set,pcVar2);
  *base = aVar1;
  iVar5 = -1;
  if (aVar1 != 0xffffffff) {
    pcVar2 = strtok((char *)0x0,"(,)");
    aVar1 = acmod_set_name2id(acmod_set,pcVar2);
    *left = aVar1;
    if (aVar1 != 0xffffffff) {
      pcVar2 = strtok((char *)0x0,"(,)");
      aVar1 = acmod_set_name2id(acmod_set,pcVar2);
      *right = aVar1;
      if (aVar1 != 0xffffffff) {
        pcVar2 = strtok((char *)0x0,"(,)");
        if (pcVar2 != (char *)0x0) {
          cVar3 = *pcVar2;
          for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
            if (cVar3 == "besiu"[lVar4]) {
              *posn = (word_posn_t)lVar4;
              cVar3 = *pcVar2;
              break;
            }
          }
          iVar5 = 0;
          if (cVar3 != '<') goto LAB_001102f7;
        }
        *posn = WORD_POSN_INTERNAL;
        iVar5 = 0;
      }
    }
  }
LAB_001102f7:
  free(__s);
  return iVar5;
}

Assistant:

int
acmod_set_s2_parse_triphone(acmod_set_t *acmod_set,
			    acmod_id_t *base,
			    acmod_id_t *left,
			    acmod_id_t *right,
			    word_posn_t *posn,
			    char *str)
{
    char *tok;
    char *save;
    uint32 i;
    char *pmap = WORD_POSN_CHAR_MAP;

    save = strdup(str);

    tok = strtok(save, "(,)");
    *base = acmod_set_name2id(acmod_set, tok);
    if (*base == NO_ACMOD)
	goto error;

    tok = strtok(NULL, "(,)");
    *left = acmod_set_name2id(acmod_set, tok);
    if (*left == NO_ACMOD)
	goto error;

    tok = strtok(NULL, "(,)");
    *right = acmod_set_name2id(acmod_set, tok);
    if (*right == NO_ACMOD)
	goto error;

    tok = strtok(NULL, "(,)");
    if (tok) {
	for (i = 0; i < strlen(pmap); i++) {
	    if (tok[0] == pmap[i])
		break;
	}

	if (i < strlen(pmap))
	    *posn = (word_posn_t)i;

	/* hack for parsing seno mapping files */
	if (tok[0] == '<')
	    *posn = WORD_POSN_INTERNAL;
    }
    else {
	*posn = WORD_POSN_INTERNAL;
    }
    
    free(save);
    return S3_SUCCESS;

error:
    free(save);
    return S3_ERROR;
}